

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O0

int Pdr_ManSolve(Aig_Man_t *pAig,Pdr_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Pdr_Man_t *p_00;
  Vec_Int_t *pVVar6;
  Vec_Str_t *vStr;
  abctime aVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  abctime clk;
  int RetValue;
  int k;
  Pdr_Man_t *p;
  Pdr_Par_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  aVar5 = Abc_Clock();
  if ((pPars->nTimeOutOne != 0) && (pPars->fSolveAll == 0)) {
    pPars->nTimeOutOne = 0;
  }
  if ((pPars->nTimeOutOne != 0) && (pPars->nTimeOut == 0)) {
    iVar3 = pPars->nTimeOutOne;
    iVar1 = Saig_ManPoNum(pAig);
    iVar4 = pPars->nTimeOutOne;
    iVar2 = Saig_ManPoNum(pAig);
    pPars->nTimeOut = (iVar3 * iVar1) / 1000 + (uint)(0 < (iVar4 * iVar2) % 1000);
  }
  if (pPars->fVerbose != 0) {
    Abc_Print(1,"VarMax = %d. FrameMax = %d. QueMax = %d. TimeMax = %d. ",
              (ulong)(uint)pPars->nRecycle,(ulong)(uint)pPars->nFrameMax,
              (ulong)(uint)pPars->nRestLimit,(ulong)(uint)pPars->nTimeOut);
    pcVar9 = "no";
    if (pPars->fMonoCnf != 0) {
      pcVar9 = "yes";
    }
    pcVar8 = "no";
    if (pPars->fSkipGeneral != 0) {
      pcVar8 = "yes";
    }
    pcVar10 = "no";
    if (pPars->fSolveAll != 0) {
      pcVar10 = "yes";
    }
    Abc_Print(1,"MonoCNF = %s. SkipGen = %s. SolveAll = %s.\n",pcVar9,pcVar8,pcVar10);
  }
  if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pAig->pSeqModel);
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
  }
  p_00 = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
  iVar3 = Pdr_ManSolveInt(p_00);
  if (((iVar3 == 0) && (pAig->pSeqModel == (Abc_Cex_t *)0x0)) && (p_00->vCexes == (Vec_Ptr_t *)0x0))
  {
    __assert_fail("pAig->pSeqModel != NULL || p->vCexes != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrCore.c"
                  ,0x393,"int Pdr_ManSolve(Aig_Man_t *, Pdr_Par_t *)");
  }
  if (p_00->vCexes != (Vec_Ptr_t *)0x0) {
    if (p_00->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrCore.c"
                    ,0x396,"int Pdr_ManSolve(Aig_Man_t *, Pdr_Par_t *)");
    }
    p_00->pAig->vSeqModelVec = p_00->vCexes;
    p_00->vCexes = (Vec_Ptr_t *)0x0;
  }
  if (p_00->pPars->fDumpInv != 0) {
    pVVar6 = Pdr_ManDeriveInfinityClauses(p_00,(uint)(iVar3 != 1));
    Abc_FrameSetCnf(pVVar6);
    vStr = Pdr_ManDumpString(p_00);
    Abc_FrameSetStr(vStr);
    pVVar6 = Pdr_ManCountFlopsInv(p_00);
    Abc_FrameSetInv(pVVar6);
    Pdr_ManDumpClauses(p_00,"inv.pla",(uint)(iVar3 == 1));
  }
  aVar7 = Abc_Clock();
  p_00->tTotal = (aVar7 - aVar5) + p_00->tTotal;
  Pdr_ManStop(p_00);
  pPars->iFrame = pPars->iFrame + -1;
  if (pPars->vOutMap != (Vec_Int_t *)0x0) {
    for (clk._4_4_ = 0; iVar4 = Saig_ManPoNum(pAig), clk._4_4_ < iVar4; clk._4_4_ = clk._4_4_ + 1) {
      iVar4 = Vec_IntEntry(pPars->vOutMap,clk._4_4_);
      if (iVar4 == -2) {
        Vec_IntWriteEntry(pPars->vOutMap,clk._4_4_,-1);
      }
    }
  }
  if (pPars->fUseBridge != 0) {
    Gia_ManToBridgeAbort(_stdout,7,(uchar *)"timeout");
  }
  return iVar3;
}

Assistant:

int Pdr_ManSolve( Aig_Man_t * pAig, Pdr_Par_t * pPars )
{
    Pdr_Man_t * p;
    int k, RetValue;
    abctime clk = Abc_Clock();
    if ( pPars->nTimeOutOne && !pPars->fSolveAll )
        pPars->nTimeOutOne = 0;
    if ( pPars->nTimeOutOne && pPars->nTimeOut == 0 )
        pPars->nTimeOut = pPars->nTimeOutOne * Saig_ManPoNum(pAig) / 1000 + (int)((pPars->nTimeOutOne * Saig_ManPoNum(pAig) % 1000) > 0);
    if ( pPars->fVerbose )
    {
//    Abc_Print( 1, "Running PDR by Niklas Een (aka IC3 by Aaron Bradley) with these parameters:\n" );
        Abc_Print( 1, "VarMax = %d. FrameMax = %d. QueMax = %d. TimeMax = %d. ",
            pPars->nRecycle,
            pPars->nFrameMax,
            pPars->nRestLimit,
            pPars->nTimeOut );
        Abc_Print( 1, "MonoCNF = %s. SkipGen = %s. SolveAll = %s.\n",
            pPars->fMonoCnf ?     "yes" : "no",
            pPars->fSkipGeneral ? "yes" : "no",
            pPars->fSolveAll ?    "yes" : "no" );
    }
    ABC_FREE( pAig->pSeqModel );
    p = Pdr_ManStart( pAig, pPars, NULL );
    RetValue = Pdr_ManSolveInt( p );
    if ( RetValue == 0 )
        assert( pAig->pSeqModel != NULL || p->vCexes != NULL );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
    if ( p->pPars->fDumpInv )
    {
        Abc_FrameSetCnf( Pdr_ManDeriveInfinityClauses( p, RetValue!=1 ) );
        Abc_FrameSetStr( Pdr_ManDumpString(p) );
        Abc_FrameSetInv( Pdr_ManCountFlopsInv(p) );
        Pdr_ManDumpClauses( p, (char *)"inv.pla", RetValue==1 );
    }
    p->tTotal += Abc_Clock() - clk;
    Pdr_ManStop( p );
    pPars->iFrame--;
    // convert all -2 (unknown) entries into -1 (undec)
    if ( pPars->vOutMap )
        for ( k = 0; k < Saig_ManPoNum(pAig); k++ )
            if ( Vec_IntEntry(pPars->vOutMap, k) == -2 ) // unknown
                Vec_IntWriteEntry( pPars->vOutMap, k, -1 ); // undec
    if ( pPars->fUseBridge )
        Gia_ManToBridgeAbort( stdout, 7, (unsigned char *)"timeout" );
    return RetValue;
}